

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

size_type __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::erase(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
        *this,key_type *key)

{
  iterator pos;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>,_unsigned_long>
  local_60;
  TrivialKey local_40;
  Node *local_38;
  InnerMap *pIStack_30;
  size_type local_28;
  
  local_40.key_ = key;
  InnerMap::FindHelper(&local_60,this->elements_,&local_40,(TreeIterator *)0x0);
  if (local_60.first.node_ != (Node *)0x0) {
    local_38 = local_60.first.node_;
    pIStack_30 = local_60.first.m_;
    local_28 = local_60.first.bucket_index_;
    pos.it_.m_ = local_60.first.m_;
    pos.it_.node_ = local_60.first.node_;
    pos.it_.bucket_index_ = local_60.first.bucket_index_;
    erase((iterator *)&local_60,this,pos);
  }
  return (ulong)(local_60.first.node_ != (Node *)0x0);
}

Assistant:

size_type erase(const key_type& key) {
    iterator it = find(key);
    if (it == end()) {
      return 0;
    } else {
      erase(it);
      return 1;
    }
  }